

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  undefined8 uVar1;
  bool bVar2;
  iterator __begin4;
  iterator __end4;
  string_type s;
  undefined1 auStack_148 [64];
  undefined1 local_108 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [64];
  iterator local_68;
  
  bVar2 = has_relative_path(this);
  if (bVar2) {
    if ((this->_path)._M_string_length != 0) {
      begin((iterator *)local_a8,this);
      end((iterator *)auStack_148,this);
      iterator::operator--((iterator *)auStack_148);
      uVar1 = auStack_148._24_8_;
      std::__cxx11::string::~string((string *)(auStack_148 + 0x20));
      std::__cxx11::string::~string((string *)(local_a8 + 0x20));
      if (local_a8._24_8_ != uVar1) {
        (__return_storage_ptr__->_path)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_path).field_2;
        (__return_storage_ptr__->_path)._M_string_length = 0;
        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
        begin((iterator *)auStack_148,this);
        end((iterator *)local_108,this);
        iterator::operator--((iterator *)local_108);
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  ((input_iterator_range<ghc::filesystem::path::iterator> *)local_a8,
                   (iterator *)auStack_148,(iterator *)local_108);
        std::__cxx11::string::~string((string *)(local_108 + 0x20));
        std::__cxx11::string::~string((string *)(auStack_148 + 0x20));
        iterator::iterator((iterator *)auStack_148,(iterator *)local_a8);
        iterator::iterator((iterator *)local_108,&local_68);
        while (auStack_148._24_8_ != local_108._24_8_) {
          std::__cxx11::string::string((string *)&local_c8,(string *)(auStack_148 + 0x20));
          bVar2 = std::operator==(&local_c8,"/");
          if (bVar2) {
            concat<std::__cxx11::string>(__return_storage_ptr__,&local_c8);
          }
          else {
            append<std::__cxx11::string>(__return_storage_ptr__,&local_c8);
          }
          std::__cxx11::string::~string((string *)&local_c8);
          iterator::operator++((iterator *)auStack_148);
        }
        std::__cxx11::string::~string((string *)(local_108 + 0x20));
        std::__cxx11::string::~string((string *)(auStack_148 + 0x20));
        input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                  ((input_iterator_range<ghc::filesystem::path::iterator> *)local_a8);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    if (has_relative_path()) {
        if (empty() || begin() == --end()) {
            return path();
        }
        else {
            path pp;
            for (string_type s : input_iterator_range<iterator>(begin(), --end())) {
                if (s == "/") {
                    // don't use append to join a path-
                    pp += s;
                }
                else {
                    pp /= s;
                }
            }
            return pp;
        }
    }
    else {
        return *this;
    }
}